

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expand_environment_variables.cpp
# Opt level: O1

string * __thiscall
tlx::expand_environment_variables_abi_cxx11_(string *__return_storage_ptr__,tlx *this,char *s)

{
  allocator local_11;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)this,&local_11);
  expand_environment_variables(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string expand_environment_variables(const char* s) {
    std::string copy = s;
    expand_environment_variables(&copy);
    return copy;
}